

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_cobs.c
# Opt level: O3

ssize_t mpt_encode_cobs(mpt_encode_state *info,iovec *cobs,iovec *base)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  char cVar8;
  byte bVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  iovec tmp;
  iovec local_28;
  
  if (cobs == (iovec *)0x0) {
    info->_ctx = 0;
    info->done = 0;
    info->scratch = 0;
    uVar2 = 0;
  }
  else {
    local_28.iov_len = info->done;
    uVar10 = info->scratch;
    uVar13 = cobs->iov_len;
    cVar8 = (char)uVar10;
    if (cobs->iov_base == (void *)0x0) {
      uVar2 = (ulong)-(uint)(((uVar10 & 0xff) != 0 || local_28.iov_len != 0) || uVar13 != 0) |
              0xffffffffffffffef;
    }
    else {
      uVar2 = 0xffffffffffffffff;
      uVar6 = uVar13 - local_28.iov_len;
      if ((local_28.iov_len <= uVar13) && (uVar13 = uVar10 & 0xff, uVar13 <= uVar6)) {
        pcVar5 = (char *)((long)cobs->iov_base + local_28.iov_len);
        if (base == (iovec *)0x0) {
          uVar2 = 0xffffffffffffffef;
          if (uVar13 < uVar6) {
            if (cVar8 == '\0') {
              if (uVar6 < 2) {
                return -0x11;
              }
              pcVar5[0] = '\x01';
              pcVar5[1] = '\0';
              sVar4 = 2;
            }
            else {
              *pcVar5 = cVar8;
              pcVar5[uVar13] = '\0';
              sVar4 = ((int)uVar10 + 1U & 0xff) + local_28.iov_len;
            }
            uVar2 = 0;
            info->_ctx = 0;
            info->done = sVar4;
            info->scratch = 0;
          }
        }
        else {
          sVar4 = base->iov_len;
          if (sVar4 == 0) {
            uVar2 = 0xfffffffffffffffe;
          }
          else {
            pcVar11 = (char *)base->iov_base;
            if (pcVar11 == (char *)0x0) {
              local_28.iov_base = (void *)0x0;
              lVar7 = sVar4 + (info->_ctx == 0);
              do {
                lVar7 = lVar7 + -1;
                if (lVar7 == 0) {
                  info->_ctx = 0;
                  info->done = local_28.iov_len;
                  info->scratch = 0;
                  return local_28.iov_len;
                }
                local_28.iov_len = mpt_memrchr(&local_28,1,0);
              } while (-1 < (long)local_28.iov_len);
              uVar2 = 0xfffffffffffffffe;
            }
            else {
              if (cVar8 == '\0') {
                if (uVar6 < 2) {
                  return -0x11;
                }
                lVar7 = uVar6 - 1;
                uVar10 = 1;
              }
              else {
                lVar7 = uVar6 - uVar13;
                if (lVar7 == 0) {
                  return -0x11;
                }
              }
              pcVar5 = pcVar5 + (uVar10 & 0xff);
              do {
                bVar9 = (byte)uVar10;
                sVar1 = sVar4 - 1;
                if (sVar4 == 0) {
                  sVar4 = 0;
                  goto LAB_0011114b;
                }
                if (*pcVar11 == '\0') {
                  lVar14 = -(uVar10 & 0xff);
                  lVar3 = -1;
                  lVar15 = 1;
LAB_001110e4:
                  pcVar5[lVar14] = bVar9;
                  pcVar5 = pcVar5 + lVar15;
                  lVar3 = lVar7 + lVar3;
                  uVar10 = 1;
                }
                else {
                  *pcVar5 = *pcVar11;
                  lVar3 = lVar7 + -1;
                  uVar12 = (int)uVar10 + 1;
                  if ((char)uVar12 == -1) {
                    if (lVar3 != 0) {
                      lVar3 = -2;
                      lVar15 = 2;
                      bVar9 = 0xff;
                      lVar14 = -0xfe;
                      goto LAB_001110e4;
                    }
                    bVar9 = 0xfe;
                    lVar7 = 0;
                    goto LAB_0011114b;
                  }
                  pcVar5 = pcVar5 + 1;
                  uVar10 = (ulong)uVar12;
                }
                pcVar11 = pcVar11 + 1;
                sVar4 = sVar1;
                lVar7 = lVar3;
              } while (lVar3 != 0);
              bVar9 = (byte)uVar10;
              lVar7 = 0;
LAB_0011114b:
              pcVar5[-(uVar10 & 0xff)] = (char)uVar10;
              lVar7 = cobs->iov_len - lVar7;
              info->_ctx = info->_ctx + (lVar7 - (info->done + info->scratch));
              info->done = lVar7 - (ulong)bVar9;
              info->scratch = (ulong)bVar9;
              uVar2 = base->iov_len - sVar4;
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

extern ssize_t mpt_encode_cobs(MPT_STRUCT(encode_state) *info, const struct iovec *cobs, const struct iovec *base)
#endif
{
	const uint8_t *src;
	uint8_t *dst, code;
	size_t left, len;
	
	if (!cobs) {
		info->_ctx = 0;
		info->done = 0;
		info->scratch = 0;
		return 0;
	}
	code = info->scratch;
	len  = info->done;
	left = cobs->iov_len;
	
	/* uninitialized target */
	if (!(dst = cobs->iov_base)) {
		if (code || len || left) {
			return MPT_ERROR(BadArgument);
		}
		return MPT_ERROR(MissingBuffer);
	}
	/* bad encoder state */
	if ((len > left)
	    || (code > (left -= len))
	    || (code > left)) {
		return MPT_ERROR(BadArgument);
	}
	dst += len;
	
	/* message termination */
	if (!base) {
		/* need enough data to save end */
		if (code >= left) {
			return MPT_ERROR(MissingBuffer);
		}
		/* special case: empty message */
		if (!code) {
			if (left < 2) {
				return MPT_ERROR(MissingBuffer);
			}
			/* '\x00\x00' not allowed in cobs data stream.
			 * Decoder consumes single encoded zero. */
			dst[0] = 1;
			dst[1] = 0;
			len = 2;
		}
		/* cobs message termination */
		else {
			*dst = code;
			dst[code++] = 0;
			len += code;
		}
		info->_ctx = 0;
		info->done = len;
		info->scratch = 0;
		
		return 0;
	}
	src = base->iov_base;
	len = base->iov_len;
	
	/* start priority data */
	if (!len) {
		return MPT_ERROR(BadValue);
	}
	/* message deletion */
	if (!src) {
		struct iovec tmp;
		ssize_t pos = info->done;
		
		/* message in progress */
		if (info->_ctx) {
			--len;
		}
		tmp.iov_base = (void *) src;
		while (len--) {
			tmp.iov_len  = pos;
			if ((pos = mpt_memrchr(&tmp, 1, 0)) < 0) {
				return MPT_ERROR(BadValue);
			}
		}
		info->_ctx = 0;
		info->done = pos;
		info->scratch = 0;
		
		/* save start of encoder state for next message */
		return pos;
	}
	
	/* remaining data in cobs */
	if (code) {
		if (!(left -= code)) return MPT_ERROR(MissingBuffer);
	} else {
		if (left <= (code = 1)) return MPT_ERROR(MissingBuffer);
		--left;
	}
	dst += code;
	
	while (1) {
		uint8_t curr;
		
		/* save COBS state */
		if (!len--) {
			dst[-code] = code;
			len = 0;
			break;
		}
		
		/* end of code block */
		if (!(curr = *src++)) {
			code = MPT_cobs_zero(code, dst, left, src, len);
		}
		else {
			*(dst++) = curr; --left;
			/* reached maximum length */
			if (++code == MPT_COBS_MAXLEN) {
				/* unable to save continuation state */
				if (!left) {
					--code; --dst;
					dst[-code] = code;
					++len; --src;
					break;
				}
				/* end of code block */
				dst[-code] = code;
				code = 1;
				dst++;
				left--;
			}
		}
		/* save current state */
		if (!left) {
			dst[-code] = code;
			break;
		}
	}
	
	/* update processed data */
	left = cobs->iov_len - left;
	info->_ctx += left - info->done - info->scratch;
	info->done = left - code;
	info->scratch = code;
	
	/* return consumed size */
	return base->iov_len - len;
}